

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[38],unsigned_int,char[2],unsigned_int,char[31],unsigned_int,char[2],unsigned_int,char[73]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [38],uint *RestArgs,char (*RestArgs_1) [2],uint *RestArgs_2,
               char (*RestArgs_3) [31],uint *RestArgs_4,char (*RestArgs_5) [2],uint *RestArgs_6,
               char (*RestArgs_7) [73])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[2],unsigned_int,char[31],unsigned_int,char[2],unsigned_int,char[73]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}